

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O3

void __thiscall
vk::BinaryRegistryDetail::BinaryRegistryWriter::writeToPath
          (BinaryRegistryWriter *this,string *dstPath)

{
  deUint32 dVar1;
  pointer pcVar2;
  long lVar3;
  pointer pPVar4;
  pointer pPVar5;
  pointer ppSVar6;
  pointer ppSVar7;
  bool bVar8;
  char cVar9;
  deUint32 dVar10;
  pointer pBVar11;
  BinaryRegistryWriter *pBVar12;
  Exception *this_00;
  InternalError *this_01;
  long *plVar13;
  deUint32 dVar14;
  SparseIndexNode *pSVar15;
  undefined1 auVar16 [8];
  ulong uVar17;
  long lVar18;
  undefined8 uVar19;
  _Alloc_hider _Var20;
  long lVar21;
  long lVar22;
  SparseIndexNode *pSVar23;
  UniquePtr<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode,_de::DefaultDeleter<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode>_>
  sparseIndex;
  FilePath filePath;
  vector<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
  index;
  ofstream out;
  undefined1 local_2c8 [32];
  FilePath local_2a8;
  pointer local_288;
  BinaryRegistryWriter *local_280;
  string local_278;
  vector<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
  local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_240;
  undefined8 local_238;
  undefined1 local_230 [8];
  pointer local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  int aiStack_210 [54];
  ios_base local_138 [264];
  
  pcVar2 = (dstPath->_M_dataplus)._M_p;
  local_288 = (pointer)dstPath;
  local_280 = this;
  local_230 = (undefined1  [8])&local_220;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_230,pcVar2,pcVar2 + dstPath->_M_string_length);
  bVar8 = de::FilePath::exists((FilePath *)local_230);
  if (local_230 != (undefined1  [8])&local_220) {
    operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
  }
  if (!bVar8) {
    de::createDirectoryAndParents(((_Alloc_hider *)&local_288->id)->_M_p);
  }
  pBVar11 = (local_280->m_binaries).
            super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((local_280->m_binaries).
      super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
      ._M_impl.super__Vector_impl_data._M_finish != pBVar11) {
    local_240 = _VTT;
    local_238 = _operator_delete__;
    lVar22 = 8;
    uVar17 = 0;
    do {
      if (*(long *)((long)&pBVar11->binary + lVar22) == 0) {
        anon_unknown_8::getProgramPath
                  ((string *)local_230,(anon_unknown_8 *)((_Alloc_hider *)&local_288->id)->_M_p,
                   *(string **)((long)local_288 + 8),(deUint32)uVar17);
        local_2a8.m_path._M_dataplus._M_p = (pointer)&local_2a8.m_path.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2a8,local_230,(char *)((long)local_230 + (long)local_228));
        bVar8 = de::FilePath::exists(&local_2a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8.m_path._M_dataplus._M_p != &local_2a8.m_path.field_2) {
          operator_delete(local_2a8.m_path._M_dataplus._M_p,
                          local_2a8.m_path.field_2._M_allocated_capacity + 1);
        }
        if (bVar8) {
          deDeleteFile((char *)local_230);
        }
        uVar19 = local_220._M_allocated_capacity;
        _Var20._M_p = (pointer)local_230;
        if (local_230 != (undefined1  [8])&local_220) goto LAB_00a0c3b0;
      }
      else {
        lVar21 = *(long *)((long)pBVar11 + lVar22 + -8);
        anon_unknown_8::getProgramPath
                  (&local_278,(anon_unknown_8 *)((_Alloc_hider *)&local_288->id)->_M_p,
                   *(string **)((long)local_288 + 8),(deUint32)uVar17);
        local_2a8.m_path._M_dataplus._M_p = (pointer)&local_2a8.m_path.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2a8,local_278._M_dataplus._M_p,
                   local_278._M_dataplus._M_p + local_278._M_string_length);
        de::FilePath::getDirName_abi_cxx11_((string *)local_2c8,&local_2a8);
        local_230 = (undefined1  [8])&local_220;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_230,local_2c8._0_8_,(pointer)(local_2c8._0_8_ + local_2c8._8_8_))
        ;
        bVar8 = de::FilePath::exists((FilePath *)local_230);
        if (local_230 != (undefined1  [8])&local_220) {
          operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
          operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
        }
        if (!bVar8) {
          de::FilePath::getDirName_abi_cxx11_((string *)local_230,&local_2a8);
          de::createDirectoryAndParents((char *)local_230);
          if (local_230 != (undefined1  [8])&local_220) {
            operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
          }
        }
        std::ofstream::ofstream((string *)local_230,local_278._M_dataplus._M_p,_S_bin);
        cVar9 = std::__basic_file<char>::is_open();
        if ((cVar9 == '\0') ||
           (*(int *)((long)aiStack_210 + *(long *)((long)local_230 + -0x18)) != 0)) {
          this_00 = (Exception *)__cxa_allocate_exception(0x30);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2c8,"Failed to open ",&local_278);
          tcu::Exception::Exception(this_00,(string *)local_2c8);
          __cxa_throw(this_00,&tcu::Exception::typeinfo,tcu::Exception::~Exception);
        }
        lVar3 = *(long *)(lVar21 + 8);
        lVar18 = 0;
        if (*(long *)(lVar21 + 0x10) != lVar3) {
          lVar18 = lVar3;
        }
        std::ostream::write((char *)local_230,lVar18);
        std::ofstream::close();
        local_230 = (undefined1  [8])local_240;
        *(undefined8 *)(local_230 + *(long *)((long)local_240 + -0x18)) = local_238;
        std::filebuf::~filebuf((filebuf *)&local_228);
        std::ios_base::~ios_base(local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8.m_path._M_dataplus._M_p != &local_2a8.m_path.field_2) {
          operator_delete(local_2a8.m_path._M_dataplus._M_p,
                          local_2a8.m_path.field_2._M_allocated_capacity + 1);
        }
        uVar19 = local_278.field_2._M_allocated_capacity;
        _Var20._M_p = local_278._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
LAB_00a0c3b0:
          operator_delete(_Var20._M_p,uVar19 + 1);
        }
      }
      uVar17 = uVar17 + 1;
      pBVar11 = (local_280->m_binaries).
                super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar22 = lVar22 + 0x10;
    } while (uVar17 < (ulong)((long)(local_280->m_binaries).
                                    super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar11 >> 4)
            );
  }
  anon_unknown_8::getIndexPath
            ((string *)local_230,(anon_unknown_8 *)((_Alloc_hider *)&local_288->id)->_M_p,
             *(string **)((long)local_288 + 8));
  local_2a8.m_path._M_dataplus._M_p = (pointer)&local_2a8.m_path.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a8,local_230,(char *)((long)local_230 + (long)local_228));
  if (local_230 != (undefined1  [8])&local_220) {
    operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
  }
  local_258.
  super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258.
  super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
  ._M_impl.super__Vector_impl_data._M_start = (BinaryIndexNode *)0x0;
  local_258.
  super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar4 = (local_280->m_binaryIndices).
           super__Vector_base<vk::BinaryRegistryDetail::ProgramIdentifierIndex,_std::allocator<vk::BinaryRegistryDetail::ProgramIdentifierIndex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar5 = (local_280->m_binaryIndices).
           super__Vector_base<vk::BinaryRegistryDetail::ProgramIdentifierIndex,_std::allocator<vk::BinaryRegistryDetail::ProgramIdentifierIndex>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar22 = (long)pPVar5 - (long)pPVar4;
  local_288 = (pointer)0x0;
  if (lVar22 != 0) {
    local_288 = pPVar4;
  }
  local_2c8._0_8_ = operator_new(0x20);
  (((SparseIndexNode *)local_2c8._0_8_)->children).
  super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (((SparseIndexNode *)local_2c8._0_8_)->children).
  super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((SparseIndexNode *)local_2c8._0_8_)->word = 0;
  ((SparseIndexNode *)local_2c8._0_8_)->index = 0;
  (((SparseIndexNode *)local_2c8._0_8_)->children).
  super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (pPVar4 == pPVar5) {
LAB_00a0c5c5:
    uVar19 = local_2c8._0_8_;
    anon_unknown_8::normalizeSparseIndex((SparseIndexNode *)local_2c8._0_8_);
    dVar10 = anon_unknown_8::getIndexSize((SparseIndexNode *)uVar19);
    if (dVar10 == 0) {
      std::
      vector<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
      ::resize(&local_258,1);
      (local_258.
       super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
       ._M_impl.super__Vector_impl_data._M_start)->word = 0;
      (local_258.
       super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
       ._M_impl.super__Vector_impl_data._M_start)->index = 0;
    }
    else {
      std::
      vector<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
      ::resize(&local_258,(ulong)dVar10);
      anon_unknown_8::addAndCountNodes
                (local_258.
                 super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
                 ._M_impl.super__Vector_impl_data._M_start,0,(SparseIndexNode *)uVar19);
    }
    de::details::
    UniqueBase<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode,_de::DefaultDeleter<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode>_>
    ::~UniqueBase((UniqueBase<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode,_de::DefaultDeleter<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode>_>
                   *)local_2c8);
    de::FilePath::getDirName_abi_cxx11_((string *)local_2c8,&local_2a8);
    local_230 = (undefined1  [8])&local_220;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_230,local_2c8._0_8_,(pointer)(local_2c8._0_8_ + local_2c8._8_8_));
    bVar8 = de::FilePath::exists((FilePath *)local_230);
    if (local_230 != (undefined1  [8])&local_220) {
      operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
    }
    if ((SparseIndexNode *)local_2c8._0_8_ != (SparseIndexNode *)(local_2c8 + 0x10)) {
      operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
    }
    if (!bVar8) {
      de::FilePath::getDirName_abi_cxx11_((string *)local_230,&local_2a8);
      de::createDirectoryAndParents((char *)local_230);
      if (local_230 != (undefined1  [8])&local_220) {
        operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
      }
    }
    std::ofstream::ofstream(local_230,local_2a8.m_path._M_dataplus._M_p,_S_bin);
    cVar9 = std::__basic_file<char>::is_open();
    if ((cVar9 != '\0') && (*(int *)((long)aiStack_210 + *(long *)((long)local_230 + -0x18)) == 0))
    {
      std::ostream::write(local_230,
                          (long)local_258.
                                super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
                                ._M_impl.super__Vector_impl_data._M_start);
      local_230 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_230 + *(long *)((long)_VTT + -0x18)) = _operator_delete__;
      std::filebuf::~filebuf((filebuf *)&local_228);
      std::ios_base::~ios_base(local_138);
      if (local_258.
          super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
          ._M_impl.super__Vector_impl_data._M_start != (BinaryIndexNode *)0x0) {
        operator_delete(local_258.
                        super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_258.
                              super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_258.
                              super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8.m_path._M_dataplus._M_p != &local_2a8.m_path.field_2) {
        operator_delete(local_2a8.m_path._M_dataplus._M_p,
                        local_2a8.m_path.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    this_01 = (InternalError *)__cxa_allocate_exception(0x38);
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_278,"Failed to open program binary index file ","");
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_278);
    local_2c8._0_8_ = *plVar13;
    pSVar23 = (SparseIndexNode *)(plVar13 + 2);
    if ((SparseIndexNode *)local_2c8._0_8_ == pSVar23) {
      local_2c8._16_4_ = pSVar23->word;
      local_2c8._20_4_ = pSVar23->index;
      local_2c8._24_8_ = plVar13[3];
      local_2c8._0_8_ = (SparseIndexNode *)(local_2c8 + 0x10);
    }
    else {
      local_2c8._16_4_ = pSVar23->word;
      local_2c8._20_4_ = pSVar23->index;
    }
    local_2c8._8_8_ = plVar13[1];
    *plVar13 = (long)pSVar23;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    tcu::InternalError::InternalError(this_01,(string *)local_2c8);
    __cxa_throw(this_01,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
  }
  local_240 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((lVar22 >> 3) * -0x71c71c71c71c71c7);
  pBVar12 = (BinaryRegistryWriter *)0x0;
LAB_00a0c4a8:
  pPVar4 = local_288 + (long)pBVar12;
  local_280 = pBVar12;
  anon_unknown_8::getSearchPath
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_230,&pPVar4->id);
  uVar17 = (long)local_228 - (long)local_230 >> 2;
  dVar10 = pPVar4->index;
  auVar16 = local_230;
  pSVar23 = (SparseIndexNode *)local_2c8._0_8_;
  do {
    ppSVar6 = (pSVar23->children).
              super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppSVar7 = (pSVar23->children).
              super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    lVar22 = (long)ppSVar7 - (long)ppSVar6 >> 3;
    dVar1 = *(deUint32 *)auVar16;
    if (ppSVar7 != ppSVar6) {
      lVar21 = 0;
      do {
        pSVar15 = ppSVar6[lVar21];
        if (pSVar15->word == dVar1) goto LAB_00a0c579;
        lVar21 = lVar21 + 1;
      } while (lVar22 + (ulong)(lVar22 == 0) != lVar21);
    }
    std::
    vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
    ::reserve(&pSVar23->children,lVar22 + 1);
    local_278._M_dataplus._M_p = (pointer)operator_new(0x20);
    dVar14 = 0;
    if (uVar17 == 1) {
      dVar14 = dVar10;
    }
    *(deUint32 *)local_278._M_dataplus._M_p = dVar1;
    *(deUint32 *)((long)local_278._M_dataplus._M_p + 4) = dVar14;
    *(int *)((long)(local_278._M_dataplus._M_p + 8) + 0) = 0;
    *(int *)((long)(local_278._M_dataplus._M_p + 8) + 4) = 0;
    *(int *)((long)(local_278._M_dataplus._M_p + 0x10) + 0) = 0;
    *(int *)((long)(local_278._M_dataplus._M_p + 0x10) + 4) = 0;
    *(int *)((long)(local_278._M_dataplus._M_p + 0x18) + 0) = 0;
    *(int *)((long)(local_278._M_dataplus._M_p + 0x18) + 4) = 0;
    std::
    vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
    ::push_back(&pSVar23->children,(value_type *)&local_278);
    pSVar15 = (pSVar23->children).
              super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1];
LAB_00a0c579:
    if (uVar17 < 2) break;
    auVar16 = (undefined1  [8])((long)auVar16 + 4);
    uVar17 = uVar17 - 1;
    pSVar23 = pSVar15;
  } while( true );
  if (local_230 != (undefined1  [8])0x0) {
    operator_delete((void *)local_230,local_220._M_allocated_capacity - (long)local_230);
  }
  pBVar12 = (BinaryRegistryWriter *)((long)&local_280->m_dstPath + 1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pBVar12 == local_240) goto LAB_00a0c5c5;
  goto LAB_00a0c4a8;
}

Assistant:

void BinaryRegistryWriter::writeToPath (const std::string& dstPath) const
{
	if (!de::FilePath(dstPath).exists())
		de::createDirectoryAndParents(dstPath.c_str());

	DE_ASSERT(m_binaries.size() <= 0xffffffffu);
	for (size_t binaryNdx = 0; binaryNdx < m_binaries.size(); ++binaryNdx)
	{
		const BinarySlot&	slot	= m_binaries[binaryNdx];

		if (slot.referenceCount > 0)
		{
			DE_ASSERT(slot.binary);
			writeBinary(dstPath, (deUint32)binaryNdx, *slot.binary);
		}
		else
		{
			// Delete stale binary if such exists
			const std::string	progPath	= getProgramPath(dstPath, (deUint32)binaryNdx);

			if (de::FilePath(progPath).exists())
				deDeleteFile(progPath.c_str());
		}

	}

	// Write index
	{
		const de::FilePath				indexPath	= getIndexPath(dstPath);
		std::vector<BinaryIndexNode>	index;

		buildBinaryIndex(&index, m_binaryIndices.size(), !m_binaryIndices.empty() ? &m_binaryIndices[0] : DE_NULL);

		// Even in empty index there is always terminating node for the root group
		DE_ASSERT(!index.empty());

		if (!de::FilePath(indexPath.getDirName()).exists())
			de::createDirectoryAndParents(indexPath.getDirName().c_str());

		{
			std::ofstream indexOut(indexPath.getPath(), std::ios_base::binary);

			if (!indexOut.is_open() || !indexOut.good())
				throw tcu::InternalError(string("Failed to open program binary index file ") + indexPath.getPath());

			indexOut.write((const char*)&index[0], index.size()*sizeof(BinaryIndexNode));
		}
	}
}